

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_export_ostream.cpp
# Opt level: O3

void __thiscall SignedLongLong_Signed_Test::TestBody(SignedLongLong_Signed_Test *this)

{
  longlong v;
  ParamType_conflict4 *pPVar1;
  string *lhs;
  char *message;
  ScopedTrace gtest_trace_357;
  ostringstream os;
  ostringstream stdos;
  ScopedTrace local_209;
  AssertHelper local_208;
  internal local_200 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  ostringstream local_1d0;
  ostringstream local_180 [112];
  ios_base local_110 [264];
  
  testing::ScopedTrace::ScopedTrace
            (&local_209,
             "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_export_ostream.cpp"
             ,0x165,"SignedLong");
  pPVar1 = testing::WithParamInterface<long_long>::GetParam();
  v = *pPVar1;
  pstore::exchange::export_ns::ostream_base::ostream_base(&local_1d0.super_ostream_base,0x1000);
  local_1d0.str_._M_dataplus._M_p = (pointer)&local_1d0.str_.field_2;
  local_1d0.super_ostream_base._vptr_ostream_base = (_func_int **)&PTR__ostringstream_0023b498;
  local_1d0.str_._M_string_length = 0;
  local_1d0.str_.field_2._M_local_buf[0] = '\0';
  pstore::exchange::export_ns::ostream_base::write<long_long,void,void>
            (&local_1d0.super_ostream_base,v);
  std::__cxx11::ostringstream::ostringstream(local_180);
  std::ostream::_M_insert<long_long>((longlong)local_180);
  lhs = pstore::exchange::export_ns::ostringstream::str_abi_cxx11_(&local_1d0);
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_200,"os.str ()","stdos.str ()",lhs,&local_1f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if (local_200[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1f0);
    if (local_1f8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_1f8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_208,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_export_ostream.cpp"
               ,0xd8,message);
    testing::internal::AssertHelper::operator=(&local_208,(Message *)&local_1f0);
    testing::internal::AssertHelper::~AssertHelper(&local_208);
    if ((long *)local_1f0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1f0._M_dataplus._M_p + 8))();
    }
  }
  if (local_1f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1f8,local_1f8);
  }
  std::__cxx11::ostringstream::~ostringstream(local_180);
  std::ios_base::~ios_base(local_110);
  pstore::exchange::export_ns::ostringstream::~ostringstream(&local_1d0);
  testing::ScopedTrace::~ScopedTrace(&local_209);
  return;
}

Assistant:

TEST_P (SignedLongLong, Signed) {
    SCOPED_TRACE ("SignedLong");
    check (GetParam ());
}